

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O1

mz_bool mz_zip_writer_finalize_heap_archive(mz_zip_archive *pZip,void **pBuf,size_t *pSize)

{
  mz_bool mVar1;
  mz_bool mVar2;
  
  mVar1 = 0;
  mVar2 = 0;
  if ((((pZip != (mz_zip_archive *)0x0) && (mVar2 = mVar1, pSize != (size_t *)0x0)) &&
      (pBuf != (void **)0x0)) &&
     ((pZip->m_pState != (mz_zip_internal_state *)0x0 && (pZip->m_pWrite == mz_zip_heap_write_func))
     )) {
    mVar1 = mz_zip_writer_finalize_archive(pZip);
    if (mVar1 != 0) {
      *pBuf = pZip->m_pState->m_pMem;
      *pSize = pZip->m_pState->m_mem_size;
      pZip->m_pState->m_pMem = (void *)0x0;
      pZip->m_pState->m_mem_capacity = 0;
      pZip->m_pState->m_mem_size = 0;
      mVar2 = 1;
    }
  }
  return mVar2;
}

Assistant:

mz_bool mz_zip_writer_finalize_heap_archive(mz_zip_archive* pZip, void** pBuf, size_t* pSize) {
  if ((!pZip) || (!pZip->m_pState) || (!pBuf) || (!pSize))
    return MZ_FALSE;
  if (pZip->m_pWrite != mz_zip_heap_write_func)
    return MZ_FALSE;
  if (!mz_zip_writer_finalize_archive(pZip))
    return MZ_FALSE;

  *pBuf = pZip->m_pState->m_pMem;
  *pSize = pZip->m_pState->m_mem_size;
  pZip->m_pState->m_pMem = NULL;
  pZip->m_pState->m_mem_size = pZip->m_pState->m_mem_capacity = 0;
  return MZ_TRUE;
}